

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,ImWchar c)

{
  ushort uVar1;
  ulong uVar2;
  undefined6 in_register_0000000a;
  uint col_00;
  ImFontGlyph *pIVar3;
  float fVar4;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  
  uVar2 = CONCAT62(in_register_0000000a,c) & 0xffffffff;
  if ((uVar2 < (ulong)(long)(this->IndexLookup).Size) &&
     (uVar1 = (this->IndexLookup).Data[uVar2], uVar1 != 0xffff)) {
    pIVar3 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  else {
    pIVar3 = this->FallbackGlyph;
  }
  if ((pIVar3 != (ImFontGlyph *)0x0) &&
     (((undefined1  [40])*pIVar3 & (undefined1  [40])0x2) != (undefined1  [40])0x0)) {
    col_00 = col | 0xffffff;
    if (((undefined1  [40])*pIVar3 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
      col_00 = col;
    }
    fVar4 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                   ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
    ImDrawList::PrimReserve(draw_list,6,4);
    local_20.x = pIVar3->X0 * fVar4 + (float)(int)pos.x;
    local_20.y = pIVar3->Y0 * fVar4 + (float)(int)pos.y;
    local_28.x = pIVar3->X1 * fVar4 + (float)(int)pos.x;
    local_28.y = fVar4 * pIVar3->Y1 + (float)(int)pos.y;
    local_30.x = pIVar3->U0;
    local_30.y = pIVar3->V0;
    local_38.x = pIVar3->U1;
    local_38.y = pIVar3->V1;
    ImDrawList::PrimRectUV(draw_list,&local_20,&local_28,&local_30,&local_38,col_00);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale), ImVec2(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}